

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

void functionPrototype(void)

{
  int iVar1;
  typeDesc *ptVar2;
  object *poVar3;
  object *poVar4;
  char *msg;
  
  switch(currentSymbol) {
  case 0x25e:
    getSymbol();
    ptVar2 = getType(voidTypeIndex);
    goto LAB_0010892d;
  case 0x25f:
    iVar1 = intTypeIndex;
    break;
  case 0x260:
  case 0x262:
  case 0x263:
  case 0x265:
  case 0x266:
  case 0x267:
switchD_0010888d_caseD_260:
    msg = "unkown return value";
    goto LAB_00108a91;
  case 0x261:
    iVar1 = charTypeIndex;
    break;
  case 0x264:
    ptVar2 = getType(fileTypeIndex);
    iVar1 = ptVar2->refIndex;
    break;
  case 0x268:
    getSymbol();
    if (currentSymbol != 0x1f5) {
      msg = "missing identifier in prototype";
      goto LAB_00108a91;
    }
    poVar3 = find();
    ptVar2 = getType(poVar3->typeIndex);
    ptVar2 = getType(ptVar2->refIndex);
    getSymbol();
    if (currentSymbol != 99) {
      msg = "malformed return value in prototype";
      goto LAB_00108a91;
    }
    goto LAB_00108928;
  default:
    iVar1 = boolTypeIndex;
    if (currentSymbol != 0x26d) goto switchD_0010888d_caseD_260;
  }
  ptVar2 = getType(iVar1);
LAB_00108928:
  getSymbol();
LAB_0010892d:
  if (currentSymbol == 0x1f5) {
    getSymbol();
    poVar3 = findProc();
    if (poVar3 == guard) {
      poVar3 = newObj(0x2c0);
      poVar3->hasPrototype = 1;
      poVar3->retTypeIndex = ptVar2->index;
      currentLevel = currentLevel + 1;
      poVar4 = (object *)calloc(1,0x90);
      poVar4->cl = 700;
      poVar4->dsc = topScope;
      poVar4->next = guard;
      topScope = poVar4;
      poVar3->val = -1;
      if (currentSymbol == 0x12d) {
        getSymbol();
        iVar1 = arguments(1,poVar3,8);
        for (poVar4 = topScope->next; poVar4 != guard; poVar4 = poVar4->next) {
          poVar4->lev = currentLevel;
          ptVar2 = getType(poVar4->typeIndex);
          iVar1 = iVar1 - ptVar2->size;
          poVar4->val = iVar1;
        }
        poVar3->dsc = topScope;
        if (currentSymbol == 0x12e) {
          getSymbol();
          if (currentSymbol == 0xcb) {
            topScope = topScope->dsc;
            currentLevel = currentLevel + -1;
            getSymbol();
            return;
          }
          msg = "prototype already declared";
        }
        else {
          msg = "missing right paranthesis in procedure declaration/prototype";
        }
      }
      else {
        msg = "no valid argument definitions";
      }
    }
    else {
      msg = "multiple prototypes not allowed";
    }
  }
  else {
    msg = "missing identifier in procedure prototype";
  }
LAB_00108a91:
  mark(msg);
  exit(-1);
}

Assistant:

procedure 
void functionPrototype(void) {
	variable struct object *obj; variable struct object *typeObj; variable struct object *proc;
	variable struct typeDesc *retType; variable struct typeDesc *varType;
	variable int markSize; variable int lclBlkSize;	variable int parBlkSize; variable int protoTypeDeclared;
	variable char procid[100];
	obj = NULL;	proc = NULL; retType = NULL; varType = NULL; typeObj = NULL;
	markSize = 8; lclBlkSize = 0; parBlkSize = 0; protoTypeDeclared = 1;

	if (currentSymbol == SYMBOL_INT) {
		retType = getType(intTypeIndex);
		getSymbol();	
	} elsif (currentSymbol == SYMBOL_FD) {
		retType = getType(fileTypeIndex);
		retType = getType(retType->refIndex);
		getSymbol();
	} elsif (currentSymbol == SYMBOL_CHAR) {
		retType = getType(charTypeIndex);
		getSymbol();
	} elsif (currentSymbol == SYMBOL_BOOL) {
		retType = getType(boolTypeIndex);
		getSymbol();
	} elsif (currentSymbol == SYMBOL_VOID) {
		getSymbol();
		retType = getType(voidTypeIndex);
	} elsif (currentSymbol == SYMBOL_STRUCT) { 
		getSymbol();
		if (currentSymbol == SYMBOL_IDENTIFIER) {
			typeObj = find();
			retType = getType(typeObj->typeIndex);
			retType = getType(retType->refIndex);
			getSymbol();
			if (currentSymbol == SYMBOL_MUL) {
				getSymbol(); 
			} else {
				mark("malformed return value in prototype");
				exit(-1);
			}
		} else {
			mark("missing identifier in prototype");
			exit(-1);
		}
	} else {
		mark("unkown return value");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_IDENTIFIER) {
		getSymbol();
		proc = findProc();
		if (proc != guard) {
			mark("multiple prototypes not allowed");
			exit(-1);
		} else {
			stringCopy(idName,procid);
			proc = newObj(CLASS_PROC);
			proc->hasPrototype = true;
			proc->retTypeIndex = retType->index;
			parBlkSize = markSize;
			incLevel(1);
			openScope();
			proc->val = -1;
		}
	} else {
		mark("missing identifier in procedure prototype");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_LPARAN) {
		getSymbol();
		parBlkSize = arguments(1,proc,parBlkSize);
		lclBlkSize = parBlkSize;
		obj = topScope->next;
		while (obj != guard) {
			obj->lev = currentLevel;
			varType = getType(obj->typeIndex);
			lclBlkSize = lclBlkSize - varType->size;
			obj->val = lclBlkSize;
			obj = obj->next;
		}
		proc->dsc = topScope; /* keep possibiliy for setting topScope correctly in functionBlock */
		if (currentSymbol == SYMBOL_RPARAN) {
			getSymbol();
		} 
		else {
			mark("missing right paranthesis in procedure declaration/prototype");
			exit(-1);
		}
	} else {
		mark("no valid argument definitions");
		exit(-1);
	}
	if (currentSymbol == SYMBOL_SEMICOLON)  { 
		closeScope(); incLevel(-1);
		getSymbol();
	} else {
		mark("prototype already declared");
		exit(-1);
	}
}